

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O2

int cat(int argc,char **argv)

{
  undefined1 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  pointer ppVar5;
  int iVar6;
  int iVar7;
  pointer ppVar8;
  int iVar9;
  uint uVar10;
  Allocator alloc;
  uint uVar11;
  ulong uVar12;
  Point2i p;
  Point2i PVar13;
  int iVar14;
  __normal_iterator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_*,_std::vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>_>
  __i;
  long lVar15;
  pointer ppVar16;
  pointer ppVar17;
  ulong uVar18;
  Point2i p_00;
  polymorphic_allocator<float> pVar19;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar20;
  char *pcVar21;
  size_t i_1;
  ulong uVar22;
  int y;
  size_t i;
  Float FVar23;
  Bounds2iIterator BVar24;
  Bounds2iIterator BVar25;
  size_t __size;
  Bounds2i pixelBounds;
  vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
  sorted;
  Bounds2iIterator __begin3;
  int va;
  int iStack_2e4;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_2e0;
  ImageChannelValues v;
  Bounds2i *local_278;
  WrapMode2D local_268;
  WrapMode2D local_260;
  WrapMode2D local_258;
  ColorEncodingHandle local_250;
  ImageAndMetadata im;
  
  if (argc == 0) {
    usage("cat","no filenames provided to \"cat\"?");
  }
  uVar22 = 0;
  bVar3 = false;
  bVar4 = false;
  bVar2 = false;
  do {
    if (uVar22 == (uint)(~(argc >> 0x1f) & argc)) {
LAB_0025c52f:
      return (int)((long)uVar22 < (long)argc);
    }
    pcVar21 = argv[uVar22];
    iVar9 = strcmp(pcVar21,"--sort");
    if ((iVar9 == 0) || (iVar9 = strcmp(pcVar21,"-sort"), iVar9 == 0)) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    else {
      iVar9 = strcmp(pcVar21,"--csv");
      if ((iVar9 == 0) || (iVar9 = strcmp(pcVar21,"-csv"), iVar9 == 0)) {
        bVar4 = (bool)(bVar4 ^ 1);
      }
      else {
        iVar9 = strcmp(pcVar21,"--list");
        if ((iVar9 == 0) || (iVar9 = strcmp(pcVar21,"-list"), iVar9 == 0)) {
          bVar3 = (bool)(bVar3 ^ 1);
        }
        else {
          if (bVar2) {
            if (bVar4) {
              pcVar21 = "imgtool: --sort and --csv don\'t make sense to use together.\n";
              __size = 0x3c;
            }
            else {
              if (!bVar3) goto LAB_0025bfad;
              pcVar21 = "imgtool: --sort and --list don\'t make sense to use together.\n";
              __size = 0x3d;
            }
            fwrite(pcVar21,__size,1,_stderr);
            goto LAB_0025c52f;
          }
LAB_0025bfad:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&va,pcVar21,(allocator<char> *)&v);
          alloc.memoryResource = pstd::pmr::new_delete_resource();
          local_250.
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )0;
          pbrt::Image::Read(&im,(string *)&va,alloc,&local_250);
          std::__cxx11::string::~string((string *)&va);
          uVar12 = (ulong)im.image.resolution.super_Tuple2<pbrt::Point2,_int> >> 0x20;
          uVar10 = im.image.resolution.super_Tuple2<pbrt::Point2,_int>.x;
          uVar11 = im.image.resolution.super_Tuple2<pbrt::Point2,_int>.y;
          va = (int)uVar10 >> 0x1f & uVar10;
          iStack_2e4 = (int)uVar11 >> 0x1f & uVar11;
          uVar18 = 0;
          if (0 < (int)uVar10) {
            uVar18 = (ulong)im.image.resolution.super_Tuple2<pbrt::Point2,_int> & 0xffffffff;
          }
          if (uVar11 == 0 || (long)im.image.resolution.super_Tuple2<pbrt::Point2,_int> < 0) {
            uVar12 = 0;
          }
          local_2e0.alloc.memoryResource = (memory_resource *)(uVar18 | uVar12 << 0x20);
          pixelBounds = pstd::optional<pbrt::Bounds2<int>_>::value_or
                                  (&im.metadata.pixelBounds,(Bounds2<int> *)&va);
          uVar18 = (ulong)pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.
                          super_Tuple2<pbrt::Point2,_int> >> 0x20;
          uVar12 = (ulong)pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.
                          super_Tuple2<pbrt::Point2,_int> >> 0x20;
          if (bVar2) {
            sorted.
            super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            sorted.
            super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            sorted.
            super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            std::
            vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
            ::reserve(&sorted,(long)((pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                                     pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.y) *
                                    (pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                                    pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.x)));
            __begin3.bounds = &pixelBounds;
            __begin3.p.super_Tuple2<pbrt::Point2,_int> =
                 pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>;
            BVar24 = pbrt::end(__begin3.bounds);
            while( true ) {
              PVar13.super_Tuple2<pbrt::Point2,_int> = __begin3.p.super_Tuple2<pbrt::Point2,_int>;
              ppVar8 = sorted.
                       super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              ppVar17 = sorted.
                        super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              iVar9 = __begin3.p.super_Tuple2<pbrt::Point2,_int>.x;
              iVar14 = __begin3.p.super_Tuple2<pbrt::Point2,_int>.y;
              if (((__begin3.p.super_Tuple2<pbrt::Point2,_int>.x ==
                    BVar24.p.super_Tuple2<pbrt::Point2,_int>.x) &&
                  (__begin3.p.super_Tuple2<pbrt::Point2,_int>.y ==
                   BVar24.p.super_Tuple2<pbrt::Point2,_int>.y)) &&
                 (__begin3.bounds == BVar24.bounds)) break;
              iVar6 = pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.x;
              iVar7 = pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.y;
              pbrt::WrapMode2D::WrapMode2D(&local_258,Clamp);
              p.super_Tuple2<pbrt::Point2,_int>.x = iVar9 - iVar6;
              p.super_Tuple2<pbrt::Point2,_int>.y = iVar14 - iVar7;
              pbrt::Image::GetChannels(&v,&im.image,p,local_258);
              _va = PVar13.super_Tuple2<pbrt::Point2,_int>;
              pbrt::ImageChannelValues::ImageChannelValues((ImageChannelValues *)&local_2e0,&v);
              std::
              vector<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>,std::allocator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>>
              ::emplace_back<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>
                        ((vector<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>,std::allocator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>>
                          *)&sorted,(pair<pbrt::Point2<int>,_pbrt::ImageChannelValues> *)&va);
              pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
              ~InlinedVector(&local_2e0);
              pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
              ~InlinedVector(&v.
                              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                            );
              pbrt::Bounds2iIterator::operator++(&__begin3);
            }
            ppVar5 = sorted.
                     super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (sorted.
                super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                sorted.
                super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              lVar15 = (long)sorted.
                             super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)sorted.
                             super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>*,std::vector<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>,std::allocator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cat(int,char**)::__0>>
                        (sorted.
                         super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         sorted.
                         super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (int)LZCOUNT(lVar15 / 0x38) * 2 ^ 0x7e);
              if (lVar15 < 0x381) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>*,std::vector<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>,std::allocator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>>>,__gnu_cxx::__ops::_Iter_comp_iter<cat(int,char**)::__0>>
                          (ppVar17,ppVar8);
                ppVar17 = sorted.
                          super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                ppVar5 = sorted.
                         super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                ppVar16 = ppVar17 + 0x10;
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>*,std::vector<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>,std::allocator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>>>,__gnu_cxx::__ops::_Iter_comp_iter<cat(int,char**)::__0>>
                          (ppVar17,ppVar16);
                for (; ppVar17 = sorted.
                                 super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                    ppVar5 = sorted.
                             super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish, ppVar16 != ppVar8;
                    ppVar16 = ppVar16 + 1) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>*,std::vector<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>,std::allocator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>>>,__gnu_cxx::__ops::_Val_comp_iter<cat(int,char**)::__0>>
                            (ppVar16);
                }
              }
            }
            for (; ppVar17 != ppVar5; ppVar17 = ppVar17 + 1) {
              if (!bVar4) {
                printf("(%d, %d): ",(ulong)(uint)(ppVar17->first).super_Tuple2<pbrt::Point2,_int>.x,
                       (ulong)(uint)(ppVar17->first).super_Tuple2<pbrt::Point2,_int>.y);
              }
              lVar15 = 0;
              for (uVar12 = 0;
                  uVar18 = (ppVar17->second).
                           super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                           nStored, uVar12 < uVar18; uVar12 = uVar12 + 1) {
                paVar20 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                           *)(ppVar17->second).
                             super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                             .ptr;
                if (paVar20 ==
                    (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                     *)0x0) {
                  paVar20 = &(ppVar17->second).
                             super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                             .field_2;
                }
                uVar1 = 0x2c;
                if (uVar12 == uVar18 - 1) {
                  uVar1 = 10;
                }
                va._0_1_ = uVar1;
                pbrt::Printf<float_const&,char>
                          ("%f%c",(float *)((long)paVar20 + lVar15),(char *)&va);
                lVar15 = lVar15 + 4;
              }
            }
            std::
            vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
            ::~vector(&sorted);
          }
          else if (bVar3) {
            v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
            memoryResource._0_4_ = 1;
            va = (int)im.image.channelNames.nStored;
            if ((int)im.image.channelNames.nStored != 1) {
              pbrt::
              LogFatal<char_const(&)[18],char_const(&)[2],char_const(&)[18],int&,char_const(&)[2],int&>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp"
                         ,0x1fe,"Check failed: %s == %s with %s = %s, %s = %s",
                         (char (*) [18])"image.NChannels()",(char (*) [2])0x2cf26ec,
                         (char (*) [18])"image.NChannels()",&va,(char (*) [2])0x2cf26ec,(int *)&v);
            }
            while (iVar9 = (int)uVar18, iVar9 < (int)uVar12) {
              for (iVar14 = pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.x;
                  iVar14 < pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.x; iVar14 = iVar14 + 1)
              {
                iVar6 = pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.x;
                iVar7 = pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.y;
                pbrt::WrapMode2D::WrapMode2D(&local_260,Clamp);
                p_00.super_Tuple2<pbrt::Point2,_int>.x = iVar14 - iVar6;
                p_00.super_Tuple2<pbrt::Point2,_int>.y = iVar9 - iVar7;
                FVar23 = pbrt::Image::GetChannel(&im.image,p_00,0,local_260);
                printf("%f ",(double)FVar23);
              }
              putchar(10);
              uVar12 = (ulong)(uint)pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.y;
              uVar18 = (ulong)(iVar9 + 1);
            }
          }
          else {
            v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr =
                 (float *)&pixelBounds;
            v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
            memoryResource =
                 (memory_resource *)
                 pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.super_Tuple2<pbrt::Point2,_int>;
            BVar25 = pbrt::end((Bounds2i *)
                               v.
                               super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                               .ptr);
            BVar24 = BVar25;
            while( true ) {
              pVar19.memoryResource =
                   v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
                   memoryResource;
              local_278 = BVar24.bounds;
              iVar9 = (int)v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                           .alloc.memoryResource;
              iVar14 = v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                       alloc.memoryResource._4_4_;
              if ((((int)v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                         alloc.memoryResource == BVar24.p.super_Tuple2<pbrt::Point2,_int>.x) &&
                  (v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
                   memoryResource._4_4_ == BVar25.p.super_Tuple2<pbrt::Point2,_int>.y)) &&
                 ((Bounds2i *)
                  v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
                  local_278)) break;
              iVar6 = pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.x;
              iVar7 = pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.y;
              pbrt::WrapMode2D::WrapMode2D(&local_268,Clamp);
              PVar13.super_Tuple2<pbrt::Point2,_int>.x = iVar9 - iVar6;
              PVar13.super_Tuple2<pbrt::Point2,_int>.y = iVar14 - iVar7;
              pbrt::Image::GetChannels((ImageChannelValues *)&va,&im.image,PVar13,local_268);
              if (!bVar4) {
                printf("(%d, %d): ",(ulong)pVar19.memoryResource & 0xffffffff,
                       (ulong)pVar19.memoryResource >> 0x20);
              }
              lVar15 = 0;
              for (uVar12 = 0; BVar24.bounds = local_278,
                  BVar24.p.super_Tuple2<pbrt::Point2,_int> =
                       BVar25.p.super_Tuple2<pbrt::Point2,_int>.super_Tuple2<pbrt::Point2,_int>,
                  uVar12 < local_2e0.nAlloc; uVar12 = uVar12 + 1) {
                pVar19.memoryResource = local_2e0.alloc.memoryResource;
                if (local_2e0.alloc.memoryResource == (memory_resource *)0x0) {
                  pVar19.memoryResource = (memory_resource *)&local_2e0.ptr;
                }
                uVar1 = 0x2c;
                if (uVar12 == local_2e0.nAlloc - 1) {
                  uVar1 = 10;
                }
                sorted.
                super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)CONCAT71(sorted.
                                       super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,uVar1);
                pbrt::Printf<float&,char>
                          ("%f%c",(float *)((long)pVar19.memoryResource + lVar15),(char *)&sorted);
                lVar15 = lVar15 + 4;
              }
              pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
              ~InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                             &va);
              pbrt::Bounds2iIterator::operator++((Bounds2iIterator *)&v);
            }
          }
          pbrt::ImageAndMetadata::~ImageAndMetadata(&im);
        }
      }
    }
    uVar22 = uVar22 + 1;
  } while( true );
}

Assistant:

int cat(int argc, char *argv[]) {
    if (argc == 0)
        usage("cat", "no filenames provided to \"cat\"?");
    bool sort = false;
    bool csv = false;
    bool list = false;

    for (int i = 0; i < argc; ++i) {
        if (strcmp(argv[i], "--sort") == 0 || strcmp(argv[i], "-sort") == 0) {
            sort = !sort;
            continue;
        }
        if (strcmp(argv[i], "--csv") == 0 || strcmp(argv[i], "-csv") == 0) {
            csv = !csv;
            continue;
        }
        if (strcmp(argv[i], "--list") == 0 || strcmp(argv[i], "-list") == 0) {
            list = !list;
            continue;
        }

        if (sort && csv) {
            fprintf(stderr, "imgtool: --sort and --csv don't make sense to use "
                            "together.\n");
            return 1;
        }
        if (sort && list) {
            fprintf(stderr, "imgtool: --sort and --list don't make sense to "
                            "use together.\n");
            return 1;
        }

        ImageAndMetadata im = Image::Read(argv[i]);
        ImageMetadata &metadata = im.metadata;
        Image &image = im.image;

        Bounds2i pixelBounds =
            metadata.pixelBounds.value_or(Bounds2i({0, 0}, image.Resolution()));
        if (sort) {
            std::vector<std::pair<Point2i, ImageChannelValues>> sorted;
            sorted.reserve(pixelBounds.Area());
            for (Point2i p : pixelBounds) {
                ImageChannelValues v = image.GetChannels(
                    {p.x - pixelBounds.pMin.x, p.y - pixelBounds.pMin.y});
                sorted.push_back(std::make_pair(p, v));
            }

            std::sort(sorted.begin(), sorted.end(),
                      [](const std::pair<Point2i, ImageChannelValues> &a,
                         const std::pair<Point2i, ImageChannelValues> &b) {
                          return a.second.Average() < b.second.Average();
                      });
            for (const auto &v : sorted) {
                const ImageChannelValues &values = v.second;
                if (!csv)
                    printf("(%d, %d): ", v.first.x, v.first.y);
                for (size_t i = 0; i < values.size(); ++i)
                    Printf("%f%c", values[i], (i == values.size() - 1) ? '\n' : ',');
            }
        } else {
            if (list) {
                CHECK_EQ(image.NChannels(), 1);
                for (int y = pixelBounds.pMin.y; y < pixelBounds.pMax.y; ++y) {
                    for (int x = pixelBounds.pMin.x; x < pixelBounds.pMax.x; ++x)
                        printf("%f ",
                               image.GetChannel(
                                   {x - pixelBounds.pMin.x, y - pixelBounds.pMin.y}, 0));
                    printf("\n");
                }
            } else {
                for (Point2i p : pixelBounds) {
                    ImageChannelValues values = image.GetChannels(
                        {p.x - pixelBounds.pMin.x, p.y - pixelBounds.pMin.y});
                    if (!csv)
                        printf("(%d, %d): ", p.x, p.y);
                    for (size_t i = 0; i < values.size(); ++i)
                        Printf("%f%c", values[i], (i == values.size() - 1) ? '\n' : ',');
                }
            }
        }
    }
    return 0;
}